

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

void __thiscall Matrix2f::Matrix2f(Matrix2f *this,Vector2f *v0,Vector2f *v1,bool setColumns)

{
  byte bVar1;
  byte in_CL;
  undefined8 in_RDX;
  Matrix2f *in_RSI;
  undefined7 in_stack_ffffffffffffffe0;
  int i;
  
  i = (int)((ulong)in_RDX >> 0x20);
  bVar1 = in_CL & 1;
  if (bVar1 == 0) {
    setRow(in_RSI,i,(Vector2f *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
    setRow(in_RSI,i,(Vector2f *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
  }
  else {
    setCol(in_RSI,i,(Vector2f *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
    setCol(in_RSI,i,(Vector2f *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

Matrix2f::Matrix2f( const Vector2f& v0, const Vector2f& v1, bool setColumns )
{
	if( setColumns )
	{
		setCol( 0, v0 );
		setCol( 1, v1 );
	}
	else
	{
		setRow( 0, v0 );
		setRow( 1, v1 );
	}
}